

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_with_opts.c
# Opt level: O3

void parse_with_opts_should_handle_empty_strings(void)

{
  cJSON *pcVar1;
  long in_FS_OFFSET;
  char *error_pointer;
  char empty_string [1];
  char *local_20;
  char local_11;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_11 = '\0';
  local_20 = (char *)0x0;
  pcVar1 = cJSON_ParseWithOpts(&local_11,(char **)0x0,0);
  if (pcVar1 != (cJSON *)0x0) {
    UnityFail(" Expected NULL",0x2c);
  }
  UnityAssertEqualNumber
            ((UNITY_INT)&local_11,global_error_0 + global_error_1,(char *)0x0,0x2d,
             UNITY_DISPLAY_STYLE_HEX64);
  pcVar1 = cJSON_ParseWithOpts(&local_11,&local_20,0);
  if (pcVar1 != (cJSON *)0x0) {
    UnityFail(" Expected NULL",0x2f);
  }
  UnityAssertEqualNumber
            ((UNITY_INT)&local_11,(UNITY_INT)local_20,(char *)0x0,0x30,UNITY_DISPLAY_STYLE_HEX64);
  UnityAssertEqualNumber
            ((UNITY_INT)&local_11,global_error_0 + global_error_1,(char *)0x0,0x31,
             UNITY_DISPLAY_STYLE_HEX64);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void parse_with_opts_should_handle_empty_strings(void)
{
    const char empty_string[] = "";
    const char *error_pointer = NULL;

    TEST_ASSERT_NULL(cJSON_ParseWithOpts(empty_string, NULL, false));
    TEST_ASSERT_EQUAL_PTR(empty_string, cJSON_GetErrorPtr());

    TEST_ASSERT_NULL(cJSON_ParseWithOpts(empty_string, &error_pointer, false));
    TEST_ASSERT_EQUAL_PTR(empty_string, error_pointer);
    TEST_ASSERT_EQUAL_PTR(empty_string, cJSON_GetErrorPtr());
}